

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int stream_create(char *filename,int *handle)

{
  int *handle_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    *handle = 2;
  }
  else {
    *handle = 2;
  }
  return 0;
}

Assistant:

int stream_create(char *filename, int *handle)
{
    /*
        write to stdout
    */

    if (filename)  /* dummy statement to suppress unused parameter compiler warning */
       *handle = 2;
    else
       *handle = 2;         /*  2 = stdout */       

    return(0);
}